

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O3

size_t WOPN_CalculateBankFileSize(WOPNFile *file,uint16_t version)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (file != (WOPNFile *)0x0) {
    if (version == 1) {
      lVar1 = (ulong)file->banks_count_percussion + (ulong)file->banks_count_melodic;
      lVar2 = 0x12;
      lVar3 = 0x2080;
    }
    else {
      lVar1 = (ulong)file->banks_count_percussion + (ulong)file->banks_count_melodic;
      lVar2 = (ulong)(uint)((int)lVar1 << 5) + lVar1 * 2 + 0x12;
      lVar3 = 0x2280;
    }
    return lVar1 * lVar3 + lVar2;
  }
  return 0;
}

Assistant:

size_t WOPN_CalculateBankFileSize(WOPNFile *file, uint16_t version)
{
    size_t final_size = 0;
    size_t ins_size = 0;

    if(version == 0)
        version = wopn_latest_version;

    if(!file)
        return 0;
    final_size += 11 + 2 + 2 + 2 + 1;
    /*
     * Magic number,
     * Version,
     * Count of melodic banks,
     * Count of percussive banks,
     * Chip specific flags
     */

    if(version >= 2)
    {
        /* Melodic banks meta-data */
        final_size += (32 + 1 + 1) * file->banks_count_melodic;
        /* Percussive banks meta-data */
        final_size += (32 + 1 + 1) * file->banks_count_percussion;
    }

    if(version >= 2)
        ins_size = WOPN_INST_SIZE_V2;
    else
        ins_size = WOPN_INST_SIZE_V1;
    /* Melodic instruments */
    final_size += (ins_size * 128) * file->banks_count_melodic;
    /* Percussive instruments */
    final_size += (ins_size * 128) * file->banks_count_percussion;

    return final_size;
}